

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

void enet_peer_disconnect_later(ENetPeer *peer,enet_uint32 data)

{
  size_t *psVar1;
  ENetPeerState EVar2;
  _ENetHost *p_Var3;
  ENetHost *host;
  enet_uint32 eVar4;
  ENetOutgoingCommand *outgoingCommand;
  enet_uint8 eVar5;
  
  if ((peer->state - ENET_PEER_STATE_CONNECTED < 2) &&
     ((((peer->outgoingCommands).sentinel.next != &(peer->outgoingCommands).sentinel ||
       ((peer->outgoingSendReliableCommands).sentinel.next !=
        &(peer->outgoingSendReliableCommands).sentinel)) ||
      ((peer->sentReliableCommands).sentinel.next != &(peer->sentReliableCommands).sentinel)))) {
    peer->state = ENET_PEER_STATE_DISCONNECT_LATER;
    peer->eventData = data;
    return;
  }
  if ((ENET_PEER_STATE_ZOMBIE < peer->state) || ((0x381U >> (peer->state & 0x1f) & 1) == 0)) {
    enet_peer_reset_queues(peer);
    EVar2 = peer->state;
    outgoingCommand = (ENetOutgoingCommand *)(*callbacks.malloc)(0x60);
    if (outgoingCommand == (ENetOutgoingCommand *)0x0) {
      (*callbacks.no_memory)();
      return;
    }
    eVar5 = 'D';
    if (EVar2 - ENET_PEER_STATE_CONNECTED < 2) {
      eVar5 = 0x84;
    }
    (outgoingCommand->command).header.command = eVar5;
    (outgoingCommand->command).header.channelID = 0xff;
    (outgoingCommand->command).disconnect.data =
         data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
    outgoingCommand->fragmentOffset = 0;
    outgoingCommand->fragmentLength = 0;
    outgoingCommand->packet = (ENetPacket *)0x0;
    enet_peer_setup_outgoing_command(peer,outgoingCommand);
    if (1 < peer->state - ENET_PEER_STATE_CONNECTED) {
      host = peer->host;
      eVar4 = enet_time_get();
      host->serviceTime = eVar4;
      enet_protocol_send_outgoing_commands(host,(ENetEvent *)0x0,0);
      enet_peer_reset(peer);
      return;
    }
    p_Var3 = peer->host;
    if (peer->incomingBandwidth != 0) {
      psVar1 = &p_Var3->bandwidthLimitedPeers;
      *psVar1 = *psVar1 - 1;
    }
    psVar1 = &p_Var3->connectedPeers;
    *psVar1 = *psVar1 - 1;
    peer->state = ENET_PEER_STATE_DISCONNECTING;
  }
  return;
}

Assistant:

void enet_peer_disconnect_later(ENetPeer *peer, enet_uint32 data) {
        if ((peer->state == ENET_PEER_STATE_CONNECTED || peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
            enet_peer_has_outgoing_commands(peer)
        ) {
            peer->state     = ENET_PEER_STATE_DISCONNECT_LATER;
            peer->eventData = data;
        } else {
            enet_peer_disconnect(peer, data);
        }
    }